

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O0

void __thiscall wasm_exporttype_t::wasm_exporttype_t(wasm_exporttype_t *this,ExportType *et)

{
  pointer pEVar1;
  size_t sVar2;
  wasm_byte_t *pwVar3;
  unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_> local_20;
  ExportType *local_18;
  ExportType *et_local;
  wasm_exporttype_t *this_local;
  
  local_18 = et;
  et_local = &this->I;
  wabt::interp::ExportType::ExportType(&this->I,et);
  pEVar1 = std::unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
           ::operator->(&et->type);
  (*pEVar1->_vptr_ExternType[2])(&local_20);
  wasm_externtype_t::New((wasm_externtype_t *)&this->extern_,&local_20);
  std::unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>::
  ~unique_ptr(&local_20);
  sVar2 = std::__cxx11::string::size();
  (this->name).size = sVar2;
  pwVar3 = (wasm_byte_t *)std::__cxx11::string::data();
  (this->name).data = pwVar3;
  return;
}

Assistant:

wasm_exporttype_t(ExportType et)
      : I(et),
        extern_{wasm_externtype_t::New(et.type->Clone())},
        name{I.name.size(), const_cast<wasm_byte_t*>(I.name.data())} {}